

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

int dwarf_lookup_pc(backtrace_state *state,dwarf_data *ddata,uintptr_t pc,
                   backtrace_full_callback callback,backtrace_error_callback error_callback,
                   void *data,int *found)

{
  unit_addrs *puVar1;
  function_addrs *pfVar2;
  int *buf;
  ulong uVar3;
  function *function;
  char *__s;
  uintptr_t *puVar4;
  undefined8 error_callback_00;
  backtrace_error_callback data_00;
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  backtrace_vector *pbVar8;
  backtrace_state *state_00;
  uchar uVar9;
  byte bVar10;
  uint16_t uVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  uchar *puVar15;
  void *pvVar16;
  function_addrs *pfVar17;
  function_addrs *pfVar18;
  unit *puVar19;
  undefined1 __dest [8];
  uint64_t uVar20;
  size_t sVar21;
  undefined8 *puVar22;
  size_t sVar23;
  uchar **ppuVar24;
  uchar **ppuVar25;
  function_vector *pfVar26;
  int64_t iVar27;
  unit *puVar28;
  size_t sVar29;
  undefined4 *puVar30;
  uint uVar31;
  backtrace_error_callback error_callback_01;
  uint uVar32;
  char *pcVar33;
  ulong uVar34;
  dwarf_buf *buf_00;
  void *pvVar35;
  size_t sVar36;
  long lVar37;
  uint uVar38;
  line *__base;
  uchar *puVar39;
  long *plVar40;
  uchar **ppuVar41;
  unit_addrs *puVar42;
  unit_addrs *puVar43;
  unit **ppuVar44;
  bool bVar45;
  int local_194;
  unit *local_190;
  undefined1 local_188 [24];
  size_t sStack_170;
  unit *local_168;
  size_t *local_160;
  undefined1 auStack_158 [8];
  dwarf_buf line_buf;
  int lineno;
  char *local_c8;
  undefined1 auStack_b8 [8];
  char *filename;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  function_addrs *pfStack_90;
  undefined1 local_88 [8];
  function_addrs *pfStack_80;
  char **local_78;
  backtrace_vector *local_70;
  ulong local_68;
  uintptr_t pc_local;
  void *local_58;
  backtrace_state *local_50;
  uchar **local_48;
  unit *local_40;
  function_vector *local_38;
  
  *found = 1;
  if ((pc != 0xffffffffffffffff && ddata->addrs_count != 0) &&
     (local_68 = pc, pc_local = (uintptr_t)error_callback, local_50 = state,
     pvVar14 = bsearch(&local_68,ddata->addrs,ddata->addrs_count,0x18,unit_addrs_search),
     error_callback_01 = (backtrace_error_callback)pc_local, pvVar14 != (void *)0x0)) {
    puVar42 = (unit_addrs *)((long)pvVar14 + -0x18);
    do {
      puVar43 = puVar42 + 1;
      puVar1 = puVar42 + 2;
      puVar42 = puVar43;
    } while (local_68 == puVar1->low);
    do {
      if (local_68 < puVar43->high) {
        ppuVar44 = &puVar43->u;
        goto LAB_0012e709;
      }
    } while ((puVar43 != ddata->addrs) &&
            (puVar42 = puVar43 + -1, puVar4 = &puVar43->low, puVar43 = puVar43 + -1,
            *puVar4 <= puVar42->low));
  }
  *found = 0;
  return 0;
LAB_0012e709:
  puVar19 = *ppuVar44;
  __base = puVar19->lines;
  local_58 = data;
  if ((((unit_addrs *)(ppuVar44 + -2) <= ddata->addrs) || (local_68 < ppuVar44[-5])) ||
     (ppuVar44[-4] <= local_68)) goto LAB_0012e758;
  if (local_50->threaded != 0) goto LAB_0012f42b;
  if (__base != (line *)0xffffffffffffffff) goto LAB_0012e762;
  ppuVar44 = ppuVar44 + -3;
  goto LAB_0012e709;
LAB_0012e758:
  if (local_50->threaded != 0) goto LAB_0012f42b;
LAB_0012e762:
  if (__base == (line *)0xffffffffffffffff) goto LAB_0012eb00;
  if (__base != (line *)0x0) goto LAB_0012e92a;
  local_188._0_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffe88 = (undefined1  [16])0x0;
  _auStack_b8 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  _local_98 = (undefined1  [16])0x0;
  local_78 = (char **)0x0;
  _local_88 = (undefined1  [16])0x0;
  uVar34 = (*ppuVar44)->lineoff;
  uVar3 = (ddata->dwarf_sections).size[1];
  puVar15 = (uchar *)(uVar3 - uVar34);
  local_168 = puVar19;
  if (uVar3 < uVar34 || puVar15 == (uchar *)0x0) {
    (*(code *)pc_local)(data,"unit line offset out of range",0);
    pvVar14 = data;
    goto LAB_0012e8aa;
  }
  line_buf.name = (char *)(ddata->dwarf_sections).data[1];
  auStack_158 = (undefined1  [8])".debug_line";
  line_buf.buf = puVar15;
  line_buf.start = (uchar *)line_buf.name + uVar34;
  line_buf.left._0_4_ = ddata->is_bigendian;
  line_buf._32_8_ = pc_local;
  line_buf.data._0_4_ = 0;
  line_buf.error_callback = (backtrace_error_callback)data;
  local_40 = *ppuVar44;
  puVar15 = (uchar *)read_initial_length((dwarf_buf *)auStack_158,&local_194);
  line_buf.buf = puVar15;
  uVar11 = read_uint16((dwarf_buf *)auStack_158);
  auVar6 = _auStack_b8;
  auStack_b8._0_4_ = CONCAT22(0,uVar11);
  if ((ushort)(uVar11 - 6) < 0xfffc) {
    pcVar33 = "unsupported line number version";
LAB_0012e893:
    buf_00 = (dwarf_buf *)auStack_158;
    iVar12 = -1;
LAB_0012e89d:
    dwarf_buf_error(buf_00,pcVar33,iVar12);
    error_callback_01 = (backtrace_error_callback)pc_local;
    pvVar14 = local_58;
  }
  else {
    if (uVar11 == 5) {
      uVar9 = read_byte((dwarf_buf *)auStack_158);
      auStack_b8[4] = uVar9;
      auStack_b8._5_3_ = 0;
      uVar9 = read_byte((dwarf_buf *)auStack_158);
      if (uVar9 != '\0') {
        pcVar33 = "non-zero segment_selector_size not supported";
        goto LAB_0012e893;
      }
    }
    else {
      filename = auVar6._8_8_;
      auStack_b8._4_4_ = local_40->addrsize;
    }
    uVar20 = read_offset((dwarf_buf *)auStack_158,local_194);
    iVar12 = (int)line_buf.data;
    data_00 = line_buf.error_callback;
    error_callback_00 = line_buf._32_8_;
    puVar15 = line_buf.start;
    line_buf._56_8_ = auStack_158;
    iVar13 = advance((dwarf_buf *)auStack_158,uVar20);
    error_callback_01 = (backtrace_error_callback)pc_local;
    pvVar14 = local_58;
    if (iVar13 != 0) {
      uVar9 = read_byte((dwarf_buf *)&line_buf.reported_underflow);
      auVar6 = _auStack_b8;
      filename._0_1_ = uVar9;
      filename._1_3_ = 0;
      auVar5 = _auStack_b8;
      auVar7 = _auStack_b8;
      auStack_b8._0_4_ = auVar6._0_4_;
      if ((int)auStack_b8._0_4_ < 4) {
        filename._4_4_ = 1;
        _auStack_b8 = auVar5;
      }
      else {
        _auStack_b8 = auVar7;
        bVar10 = read_byte((dwarf_buf *)&line_buf.reported_underflow);
        filename._4_4_ = (uint)bVar10;
      }
      buf = &line_buf.reported_underflow;
      read_byte((dwarf_buf *)buf);
      iVar13 = advance((dwarf_buf *)buf,1);
      if (iVar13 == 0) {
        iVar13 = 0;
      }
      else {
        iVar13 = (int)(char)*puVar15;
      }
      local_a8._0_4_ = iVar13;
      uVar9 = read_byte((dwarf_buf *)buf);
      local_a8[4] = uVar9;
      local_a8._5_3_ = 0;
      bVar10 = read_byte((dwarf_buf *)buf);
      local_a8[8] = bVar10;
      local_a8._9_3_ = 0;
      local_98 = (undefined1  [8])puVar15;
      iVar13 = advance((dwarf_buf *)buf,(ulong)(bVar10 - 1));
      error_callback_01 = (backtrace_error_callback)pc_local;
      pvVar14 = local_58;
      if (iVar13 != 0) {
        if ((int)auStack_b8._0_4_ < 5) {
          local_38 = (function_vector *)0x1;
          pfStack_90 = (function_addrs *)0x0;
          sVar36 = 8;
          for (puVar39 = puVar15; (puVar39 < puVar15 + uVar20 && (*puVar39 != '\0'));
              puVar39 = puVar39 + sVar21 + 1) {
            sVar21 = xstrnlen((char *)puVar39,(long)(puVar15 + uVar20) - (long)puVar39);
            pfStack_90 = (function_addrs *)local_38;
            sVar36 = sVar36 + 8;
            local_38 = (function_vector *)((long)&local_38->vec + 1);
          }
          pfStack_90 = (function_addrs *)local_38;
          puVar22 = (undefined8 *)
                    tcmalloc_backtrace_alloc
                              (local_50,sVar36,(backtrace_error_callback)error_callback_00,data_00);
          local_88 = (undefined1  [8])puVar22;
          error_callback_01 = (backtrace_error_callback)pc_local;
          pvVar14 = local_58;
          if (puVar22 != (undefined8 *)0x0) {
            *puVar22 = local_40->comp_dir;
            lVar37 = 8;
LAB_0012edb1:
            if (*puVar15 == '\0') {
              iVar13 = advance((dwarf_buf *)&line_buf.reported_underflow,1);
              error_callback_01 = (backtrace_error_callback)pc_local;
              pvVar14 = local_58;
              if (iVar13 != 0) {
                local_38 = (function_vector *)0x1;
                pfStack_80 = (function_addrs *)0x0;
                local_48 = (uchar **)(puVar15 + uVar20);
                sVar36 = 8;
                plVar40 = (long *)puVar15;
                while ((plVar40 < local_48 && ((char)*plVar40 != '\0'))) {
                  sVar21 = xstrnlen((char *)plVar40,(long)local_48 - (long)plVar40);
                  sVar23 = leb128_len((uchar *)((long)plVar40 + sVar21 + 1));
                  puVar39 = (uchar *)((long)plVar40 + sVar23 + sVar21 + 1);
                  sVar21 = leb128_len(puVar39);
                  puVar39 = puVar39 + sVar21;
                  sVar21 = leb128_len(puVar39);
                  pfStack_80 = (function_addrs *)local_38;
                  sVar36 = sVar36 + 8;
                  local_38 = (function_vector *)((long)&local_38->vec + 1);
                  plVar40 = (long *)(puVar39 + sVar21);
                }
                pfStack_80 = (function_addrs *)local_38;
                local_78 = (char **)tcmalloc_backtrace_alloc
                                              (local_50,sVar36,
                                               (backtrace_error_callback)error_callback_00,data_00);
                error_callback_01 = (backtrace_error_callback)pc_local;
                pvVar14 = local_58;
                if (local_78 != (char **)0x0) {
                  *local_78 = local_40->filename;
                  lVar37 = 8;
                  while( true ) {
                    if (*puVar15 == '\0') goto LAB_0012ed3c;
                    error_callback_01 = (backtrace_error_callback)pc_local;
                    pvVar14 = local_58;
                    if ((iVar12 != 0) ||
                       (ppuVar24 = (uchar **)read_string((dwarf_buf *)&line_buf.reported_underflow),
                       error_callback_01 = (backtrace_error_callback)pc_local, pvVar14 = local_58,
                       ppuVar24 == (uchar **)0x0)) goto LAB_0012e8aa;
                    uVar20 = read_uleb128((dwarf_buf *)&line_buf.reported_underflow);
                    ppuVar41 = ppuVar24;
                    if (*(char *)ppuVar24 != '/') break;
LAB_0012efca:
                    *(uchar ***)((long)local_78 + lVar37) = ppuVar41;
                    read_uleb128((dwarf_buf *)&line_buf.reported_underflow);
                    read_uleb128((dwarf_buf *)&line_buf.reported_underflow);
                    lVar37 = lVar37 + 8;
                  }
                  if (uVar20 < pfStack_90) {
                    ppuVar25 = *(uchar ***)((long)local_88 + uVar20 * 8);
                    if (ppuVar25 != (uchar **)0x0) {
                      local_48 = ppuVar25;
                      puVar19 = (unit *)strlen((char *)ppuVar25);
                      local_38 = (function_vector *)strlen((char *)ppuVar24);
                      local_40 = puVar19;
                      ppuVar25 = (uchar **)
                                 tcmalloc_backtrace_alloc
                                           (local_50,(size_t)((long)&((function_addrs *)local_38)->
                                                                     low +
                                                             (long)((long)&puVar19->unit_data + 2)),
                                            (backtrace_error_callback)error_callback_00,data_00);
                      puVar19 = local_40;
                      ppuVar41 = local_48;
                      error_callback_01 = (backtrace_error_callback)pc_local;
                      pvVar14 = local_58;
                      if (ppuVar25 == (uchar **)0x0) goto LAB_0012e8aa;
                      local_48 = ppuVar25;
                      memcpy(ppuVar25,ppuVar41,(size_t)local_40);
                      ppuVar41 = local_48;
                      *(uchar *)((long)&puVar19->unit_data + (long)local_48) = '/';
                      memcpy((uchar *)((long)&puVar19->unit_data + (long)((long)local_48 + 1)),
                             ppuVar24,(size_t)((long)&local_38->vec + 1));
                    }
                    goto LAB_0012efca;
                  }
                  pcVar33 = "invalid directory index in line number program header";
                  buf_00 = (dwarf_buf *)&line_buf.reported_underflow;
                  iVar12 = 0;
                  goto LAB_0012e89d;
                }
              }
            }
            else {
              error_callback_01 = (backtrace_error_callback)pc_local;
              pvVar14 = local_58;
              if (iVar12 == 0) goto code_r0x0012edca;
            }
          }
        }
        else {
          iVar13 = read_line_header_format_entries
                             (local_50,ddata,local_40,(dwarf_buf *)&line_buf.reported_underflow,
                              (line_header *)auStack_b8,(size_t *)(local_98 + 8),(char ***)local_88)
          ;
          error_callback_01 = (backtrace_error_callback)pc_local;
          pvVar14 = local_58;
          if ((iVar13 != 0) &&
             (iVar13 = read_line_header_format_entries
                                 (local_50,ddata,local_40,(dwarf_buf *)&line_buf.reported_underflow,
                                  (line_header *)auStack_b8,(size_t *)(local_88 + 8),&local_78),
             error_callback_01 = (backtrace_error_callback)pc_local, pvVar14 = local_58, iVar13 != 0
             )) {
LAB_0012ed3c:
            error_callback_01 = (backtrace_error_callback)pc_local;
            pvVar14 = local_58;
            if (iVar12 == 0) {
              if (pfStack_80 < 2) {
                puVar19 = (unit *)0x1323b8;
              }
              else {
                puVar19 = (unit *)local_78[1];
              }
              local_c8 = "invalid file number in line number program";
              pfVar26 = (function_vector *)(function_addrs *)0x0;
              ppuVar24 = (uchar **)0x0;
              puVar28 = puVar19;
              uVar38 = 1;
switchD_0012f082_caseD_6:
              uVar31 = uVar38;
              local_48 = (uchar **)CONCAT44(local_48._4_4_,(int)ppuVar24);
              puVar15 = line_buf.buf;
              local_40 = puVar28;
              local_38 = pfVar26;
              if (line_buf.buf == (uchar *)0x0) goto LAB_0012f453;
              bVar10 = read_byte((dwarf_buf *)auStack_158);
              pfVar26 = local_38;
              puVar28 = local_40;
              uVar38 = (uint)bVar10;
              if ((uint)local_a8._8_4_ <= uVar38) {
                uVar32 = (uVar38 - local_a8._8_4_) / (uint)local_a8._4_4_ + (int)local_48;
                local_48 = (uchar **)((ulong)uVar32 % (ulong)filename._4_4_);
                pfVar26 = (function_vector *)
                          ((long)&local_38->vec +
                          (ulong)((uint)filename * uVar32) / (ulong)filename._4_4_);
                uVar38 = uVar31 + local_a8._0_4_ + (uVar38 - local_a8._8_4_) % (uint)local_a8._4_4_;
                add_line(local_50,ddata,(uintptr_t)pfVar26,(char *)local_40,uVar38,
                         (backtrace_error_callback)line_buf._32_8_,line_buf.error_callback,
                         (line_vector *)local_188);
                ppuVar24 = local_48;
                goto switchD_0012f082_caseD_6;
              }
              if (0xc < uVar38) {
                uVar38 = (uint)*(byte *)((long)local_98 + ((ulong)bVar10 - 1));
                while (bVar45 = uVar38 != 0, uVar38 = uVar38 - 1, bVar45) {
                  read_uleb128((dwarf_buf *)auStack_158);
                }
                goto LAB_0012f26e;
              }
              ppuVar24 = (uchar **)((ulong)local_48 & 0xffffffff);
              uVar38 = uVar31;
              switch((ulong)bVar10) {
              case 0:
                uVar20 = read_uleb128((dwarf_buf *)auStack_158);
                bVar10 = read_byte((dwarf_buf *)auStack_158);
                ppuVar24 = (uchar **)0x0;
                pfVar26 = (function_vector *)(function_addrs *)0x0;
                puVar28 = puVar19;
                uVar38 = (uint)bVar10;
                switch(bVar10) {
                case 1:
                  break;
                case 2:
                  pfVar26 = (function_vector *)
                            read_address((dwarf_buf *)auStack_158,auStack_b8._4_4_);
                  ppuVar24 = (uchar **)((ulong)local_48 & 0xffffffff);
                  puVar28 = local_40;
                  uVar38 = uVar31;
                  break;
                case 3:
                  puVar28 = (unit *)read_string((dwarf_buf *)auStack_158);
                  if (puVar28 == (unit *)0x0) goto LAB_0012f453;
                  local_40 = puVar28;
                  local_70 = (backtrace_vector *)read_uleb128((dwarf_buf *)auStack_158);
                  read_uleb128((dwarf_buf *)auStack_158);
                  read_uleb128((dwarf_buf *)auStack_158);
                  ppuVar24 = (uchar **)((ulong)local_48 & 0xffffffff);
                  pfVar26 = local_38;
                  puVar28 = local_40;
                  uVar38 = uVar31;
                  if (*(uchar *)&local_40->unit_data != '/') {
                    if (pfStack_90 <= ((ulong)local_70 & 0xffffffff)) {
                      local_c8 = "invalid directory index in line number program";
                      goto LAB_0012f43e;
                    }
                    local_160 = *(size_t **)((long)local_88 + ((ulong)local_70 & 0xffffffff) * 8);
                    local_70 = (backtrace_vector *)strlen((char *)local_160);
                    sVar29 = strlen((char *)local_40);
                    puVar28 = (unit *)tcmalloc_backtrace_alloc
                                                (local_50,(long)&((backtrace_vector *)
                                                                 &local_70->base)->base + sVar29 + 2
                                                 ,(backtrace_error_callback)line_buf._32_8_,
                                                 line_buf.error_callback);
                    pbVar8 = local_70;
                    if (puVar28 != (unit *)0x0) {
                      local_190 = puVar28;
                      memcpy(puVar28,local_160,(size_t)local_70);
                      puVar28 = local_190;
                      *(uchar *)((long)&((backtrace_vector *)&pbVar8->base)->base +
                                (long)&local_190->unit_data) = '/';
                      memcpy((uchar *)((long)&local_190->unit_data +
                                      (long)((long)&((backtrace_vector *)&pbVar8->base)->base + 1)),
                             local_40,sVar29 + 1);
                      local_40 = puVar28;
                      goto LAB_0012f26e;
                    }
                    goto LAB_0012f453;
                  }
                  break;
                case 4:
                  goto switchD_0012f082_caseD_5;
                default:
                  goto switchD_0012f1a8_default;
                }
                goto switchD_0012f082_caseD_6;
              case 1:
                add_line(local_50,ddata,(uintptr_t)local_38,(char *)local_40,uVar31,
                         (backtrace_error_callback)line_buf._32_8_,line_buf.error_callback,
                         (line_vector *)local_188);
                ppuVar24 = (uchar **)((ulong)local_48 & 0xffffffff);
                puVar28 = local_40;
                goto switchD_0012f082_caseD_6;
              case 2:
                uVar20 = read_uleb128((dwarf_buf *)auStack_158);
                uVar34 = uVar20 + ((ulong)local_48 & 0xffffffff);
                ppuVar24 = (uchar **)(uVar34 % (ulong)filename._4_4_);
                pfVar26 = (function_vector *)
                          ((long)&local_38->vec + ((uint)filename * uVar34) / (ulong)filename._4_4_)
                ;
                puVar28 = local_40;
                goto switchD_0012f082_caseD_6;
              case 3:
                iVar27 = read_sleb128((dwarf_buf *)auStack_158);
                uVar31 = uVar31 + (int)iVar27;
                break;
              case 4:
                uVar20 = read_uleb128((dwarf_buf *)auStack_158);
                if (pfStack_80 <= uVar20) {
LAB_0012f43e:
                  dwarf_buf_error((dwarf_buf *)auStack_158,local_c8,0);
                  goto LAB_0012f453;
                }
                local_40 = (unit *)local_78[uVar20];
                break;
              case 5:
              case 0xc:
switchD_0012f082_caseD_5:
                read_uleb128((dwarf_buf *)auStack_158);
                break;
              default:
                goto switchD_0012f082_caseD_6;
              case 8:
                uVar31 = (0xff - local_a8._8_4_) / (uint)local_a8._4_4_ + (int)local_48;
                ppuVar24 = (uchar **)((ulong)uVar31 % (ulong)filename._4_4_);
                pfVar26 = (function_vector *)
                          ((long)&local_38->vec +
                          (ulong)((uint)filename * uVar31) / (ulong)filename._4_4_);
                goto switchD_0012f082_caseD_6;
              case 9:
                uVar11 = read_uint16((dwarf_buf *)auStack_158);
                ppuVar24 = (uchar **)0x0;
                pfVar26 = (function_vector *)((long)&local_38->vec + (ulong)uVar11);
                puVar28 = local_40;
                goto switchD_0012f082_caseD_6;
              }
LAB_0012f26e:
              pfVar26 = local_38;
              ppuVar24 = (uchar **)((ulong)local_48 & 0xffffffff);
              puVar28 = local_40;
              uVar38 = uVar31;
              goto switchD_0012f082_caseD_6;
            }
          }
        }
      }
    }
  }
LAB_0012e8aa:
  state_00 = local_50;
  backtrace_vector_free(local_50,(backtrace_vector *)local_188,error_callback_01,pvVar14);
  free_line_header(state_00,(line_header *)auStack_b8,error_callback_01,pvVar14);
  __base = (line *)0xffffffffffffffff;
  bVar45 = true;
  sVar21 = 0;
  puVar19 = (unit *)0x0;
  pfVar26 = (function_vector *)(function_addrs *)0x0;
  goto LAB_0012e8e7;
switchD_0012f1a8_default:
  iVar12 = advance((dwarf_buf *)auStack_158,uVar20 - 1);
  ppuVar24 = (uchar **)((ulong)local_48 & 0xffffffff);
  pfVar26 = local_38;
  puVar28 = local_40;
  uVar38 = uVar31;
  if (iVar12 == 0) goto LAB_0012f453;
  goto switchD_0012f082_caseD_6;
code_r0x0012edca:
  pcVar33 = read_string((dwarf_buf *)&line_buf.reported_underflow);
  *(char **)((long)local_88 + lVar37) = pcVar33;
  plVar40 = (long *)((long)local_88 + lVar37);
  lVar37 = lVar37 + 8;
  error_callback_01 = (backtrace_error_callback)pc_local;
  pvVar14 = local_58;
  if (*plVar40 == 0) goto LAB_0012e8aa;
  goto LAB_0012edb1;
LAB_0012f453:
  pvVar14 = local_58;
  error_callback_01 = (backtrace_error_callback)pc_local;
  if ((((puVar15 != (uchar *)0x0) || ((int)line_buf.data != 0)) || (sStack_170 == 0)) ||
     (puVar22 = (undefined8 *)
                tcmalloc_backtrace_vector_grow
                          (local_50,0x18,(backtrace_error_callback)pc_local,local_58,
                           (backtrace_vector *)local_188),
     error_callback_01 = (backtrace_error_callback)pc_local, puVar22 == (undefined8 *)0x0))
  goto LAB_0012e8aa;
  *puVar22 = 0xffffffffffffffff;
  *(undefined1 (*) [16])(puVar22 + 1) = (undefined1  [16])0x0;
  iVar12 = tcmalloc_backtrace_vector_release
                     (local_50,(backtrace_vector *)local_188,(backtrace_error_callback)pc_local,
                      pvVar14);
  error_callback_01 = (backtrace_error_callback)pc_local;
  if (iVar12 == 0) goto LAB_0012e8aa;
  __base = (line *)local_188._0_8_;
  tcmalloc_backtrace_qsort((void *)local_188._0_8_,sStack_170,0x18,line_compare);
  iVar12 = local_50->threaded;
  local_70 = &(ddata->fvec).vec;
  pfVar26 = (function_vector *)0x0;
  if (iVar12 == 0) {
    pfVar26 = (function_vector *)local_70;
  }
  local_160 = &pfVar26->count;
  puVar19 = *ppuVar44;
  local_48 = (uchar **)local_160;
  local_38 = (function_vector *)local_70;
  if (iVar12 != 0) {
    local_48 = &line_buf.buf;
    line_buf.start = (uchar *)0x0;
    line_buf.buf = (uchar *)0x0;
    _auStack_158 = (undefined1  [16])0x0;
    local_38 = (function_vector *)auStack_158;
  }
  line_buf._56_8_ = anon_var_dwarf_6abbb;
  sVar36 = puVar19->unit_data_len;
  sVar21 = sStack_170;
  local_40 = (unit *)0x0;
  do {
    if (sVar36 == 0) {
      if ((*local_48 != (uchar *)0x0) &&
         (puVar30 = (undefined4 *)
                    tcmalloc_backtrace_vector_grow
                              (local_50,0x18,(backtrace_error_callback)pc_local,local_58,
                               &local_38->vec), puVar30 != (undefined4 *)0x0)) {
        *(undefined8 *)(puVar30 + 4) = 0;
        *puVar30 = 0xffffffff;
        puVar30[1] = 0xffffffff;
        puVar30[2] = 0xffffffff;
        puVar30[3] = 0xffffffff;
        local_40 = (unit *)*local_48;
        if (iVar12 == 0) {
          local_38 = (function_vector *)
                     tcmalloc_backtrace_vector_finish
                               (local_50,local_70,(backtrace_error_callback)pc_local,local_58);
          if (local_38 != (function_vector *)0x0) {
            *local_160 = 0;
            goto LAB_0012f6a8;
          }
        }
        else {
          iVar12 = tcmalloc_backtrace_vector_release
                             (local_50,(backtrace_vector *)auStack_158,
                              (backtrace_error_callback)pc_local,local_58);
          if (iVar12 != 0) {
            local_38 = (function_vector *)(local_38->vec).base;
LAB_0012f6a8:
            tcmalloc_backtrace_qsort(local_38,(size_t)local_40,0x18,function_addrs_compare);
            goto LAB_0012f6d1;
          }
        }
      }
      local_38 = (function_vector *)0x0;
      local_40 = (unit *)0x0;
      goto LAB_0012f6d1;
    }
    iVar13 = read_function_entry(local_50,ddata,puVar19,0,(dwarf_buf *)&line_buf.reported_underflow,
                                 (line_header *)auStack_b8,(backtrace_error_callback)pc_local,
                                 local_58,local_38,local_38);
  } while (iVar13 != 0);
  local_38 = (function_vector *)0x0;
LAB_0012f6d1:
  free_line_header(local_50,(line_header *)auStack_b8,(backtrace_error_callback)pc_local,local_58);
  bVar45 = false;
  puVar19 = local_40;
  pfVar26 = local_38;
LAB_0012e8e7:
  if (local_50->threaded == 0) {
    local_168->lines_count = sVar21;
    local_168->function_addrs = (function_addrs *)pfVar26;
    local_168->function_addrs_count = (size_t)puVar19;
    local_168->lines = __base;
    if (__base != (line *)0xffffffffffffffff) {
LAB_0012e92a:
      pvVar14 = bsearch(&local_68,__base,(*ppuVar44)->lines_count,0x18,line_search);
      puVar19 = *ppuVar44;
      if (pvVar14 == (void *)0x0) {
        __dest = (undefined1  [8])puVar19->abs_filename;
        if (__dest == (undefined1  [8])0x0) {
          pcVar33 = puVar19->filename;
          if (pcVar33 == (char *)0x0) {
            __dest = (undefined1  [8])0x0;
          }
          else {
            __dest = (undefined1  [8])pcVar33;
            if ((*pcVar33 != '/') && (__s = puVar19->comp_dir, __s != (char *)0x0)) {
              puVar19 = (unit *)strlen(pcVar33);
              local_38 = (function_vector *)strlen(__s);
              local_168 = puVar19;
              __dest = (undefined1  [8])
                       tcmalloc_backtrace_alloc
                                 (local_50,(size_t)((long)&puVar19->unit_data +
                                                   (long)((long)&((function_addrs *)local_38)->low +
                                                         2)),(backtrace_error_callback)pc_local,
                                  local_58);
              pfVar26 = local_38;
              if (__dest == (undefined1  [8])0x0) {
                *found = 0;
                return 0;
              }
              memcpy((void *)__dest,__s,(size_t)local_38);
              *(char *)((long)__dest + (long)pfVar26) = '/';
              memcpy((char *)((long)__dest + (long)((long)&pfVar26->vec + 1)),pcVar33,
                     (size_t)((long)&local_168->unit_data + 1));
              puVar19 = *ppuVar44;
            }
          }
          puVar19->abs_filename = (char *)__dest;
        }
        iVar12 = 0;
      }
      else {
        if ((puVar19->function_addrs_count != 0) &&
           (pvVar16 = bsearch(&local_68,puVar19->function_addrs,puVar19->function_addrs_count,0x18,
                              function_addrs_search), pvVar35 = local_58, pvVar16 != (void *)0x0)) {
          pfVar17 = (function_addrs *)((long)pvVar16 + -0x18);
          do {
            pfVar18 = pfVar17 + 1;
            pfVar2 = pfVar17 + 2;
            pfVar17 = pfVar18;
          } while (local_68 == pfVar2->low);
          do {
            if (local_68 < pfVar18->high) {
              function = pfVar18->function;
              auStack_b8 = (undefined1  [8])*(undefined8 *)((long)pvVar14 + 8);
              line_buf.reported_underflow = *(int *)((long)pvVar14 + 0x10);
              iVar12 = report_inlined_functions
                                 (local_68,function,callback,local_58,(char **)auStack_b8,
                                  &line_buf.reported_underflow);
              if (iVar12 != 0) {
                return iVar12;
              }
              iVar12 = line_buf.reported_underflow;
              pcVar33 = function->name;
              __dest = auStack_b8;
              goto LAB_0012ebd5;
            }
          } while ((pfVar18 != (*ppuVar44)->function_addrs) &&
                  (pfVar17 = pfVar18 + -1, puVar4 = &pfVar18->low, pfVar18 = pfVar18 + -1,
                  *puVar4 <= pfVar17->low));
        }
        __dest = *(undefined1 (*) [8])((long)pvVar14 + 8);
        iVar12 = *(int *)((long)pvVar14 + 0x10);
      }
      pcVar33 = (char *)0x0;
      pvVar35 = local_58;
LAB_0012ebd5:
      iVar12 = (*callback)(pvVar35,local_68,(char *)__dest,iVar12,pcVar33);
      return iVar12;
    }
    if (!bVar45) {
      iVar12 = dwarf_lookup_pc(local_50,ddata,local_68,callback,(backtrace_error_callback)pc_local,
                               local_58,found);
      return iVar12;
    }
LAB_0012eb00:
    iVar12 = (*callback)(local_58,local_68,(char *)0x0,0,(char *)0x0);
    return iVar12;
  }
LAB_0012f42b:
  abort();
}

Assistant:

static int
dwarf_lookup_pc (struct backtrace_state *state, struct dwarf_data *ddata,
		 uintptr_t pc, backtrace_full_callback callback,
		 backtrace_error_callback error_callback, void *data,
		 int *found)
{
  struct unit_addrs *entry;
  int found_entry;
  struct unit *u;
  int new_data;
  struct line *lines;
  struct line *ln;
  struct function_addrs *p;
  struct function_addrs *fmatch;
  struct function *function;
  const char *filename;
  int lineno;
  int ret;

  *found = 1;

  /* Find an address range that includes PC.  Our search isn't safe if
     PC == -1, as we use that as a sentinel value, so skip the search
     in that case.  */
  entry = (ddata->addrs_count == 0 || pc + 1 == 0
	   ? NULL
	   : bsearch (&pc, ddata->addrs, ddata->addrs_count,
		      sizeof (struct unit_addrs), unit_addrs_search));

  if (entry == NULL)
    {
      *found = 0;
      return 0;
    }

  /* Here pc >= entry->low && pc < (entry + 1)->low.  The unit_addrs
     are sorted by low, so if pc > p->low we are at the end of a range
     of unit_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (entry + 1)->low)
    ++entry;
  found_entry = 0;
  while (1)
    {
      if (pc < entry->high)
	{
	  found_entry = 1;
	  break;
	}
      if (entry == ddata->addrs)
	break;
      if ((entry - 1)->low < entry->low)
	break;
      --entry;
    }
  if (!found_entry)
    {
      *found = 0;
      return 0;
    }

  /* We need the lines, lines_count, function_addrs,
     function_addrs_count fields of u.  If they are not set, we need
     to set them.  When running in threaded mode, we need to allow for
     the possibility that some other thread is setting them
     simultaneously.  */

  u = entry->u;
  lines = u->lines;

  /* Skip units with no useful line number information by walking
     backward.  Useless line number information is marked by setting
     lines == -1.  */
  while (entry > ddata->addrs
	 && pc >= (entry - 1)->low
	 && pc < (entry - 1)->high)
    {
      if (state->threaded)
	lines = (struct line *) backtrace_atomic_load_pointer (&u->lines);

      if (lines != (struct line *) (uintptr_t) -1)
	break;

      --entry;

      u = entry->u;
      lines = u->lines;
    }

  if (state->threaded)
    lines = backtrace_atomic_load_pointer (&u->lines);

  new_data = 0;
  if (lines == NULL)
    {
      struct function_addrs *function_addrs;
      size_t function_addrs_count;
      struct line_header lhdr;
      size_t count;

      /* We have never read the line information for this unit.  Read
	 it now.  */

      function_addrs = NULL;
      function_addrs_count = 0;
      if (read_line_info (state, ddata, error_callback, data, entry->u, &lhdr,
			  &lines, &count))
	{
	  struct function_vector *pfvec;

	  /* If not threaded, reuse DDATA->FVEC for better memory
	     consumption.  */
	  if (state->threaded)
	    pfvec = NULL;
	  else
	    pfvec = &ddata->fvec;
	  read_function_info (state, ddata, &lhdr, error_callback, data,
			      entry->u, pfvec, &function_addrs,
			      &function_addrs_count);
	  free_line_header (state, &lhdr, error_callback, data);
	  new_data = 1;
	}

      /* Atomically store the information we just read into the unit.
	 If another thread is simultaneously writing, it presumably
	 read the same information, and we don't care which one we
	 wind up with; we just leak the other one.  We do have to
	 write the lines field last, so that the acquire-loads above
	 ensure that the other fields are set.  */

      if (!state->threaded)
	{
	  u->lines_count = count;
	  u->function_addrs = function_addrs;
	  u->function_addrs_count = function_addrs_count;
	  u->lines = lines;
	}
      else
	{
	  backtrace_atomic_store_size_t (&u->lines_count, count);
	  backtrace_atomic_store_pointer (&u->function_addrs, function_addrs);
	  backtrace_atomic_store_size_t (&u->function_addrs_count,
					 function_addrs_count);
	  backtrace_atomic_store_pointer (&u->lines, lines);
	}
    }

  /* Now all fields of U have been initialized.  */

  if (lines == (struct line *) (uintptr_t) -1)
    {
      /* If reading the line number information failed in some way,
	 try again to see if there is a better compilation unit for
	 this PC.  */
      if (new_data)
	return dwarf_lookup_pc (state, ddata, pc, callback, error_callback,
				data, found);
      return callback (data, pc, NULL, 0, NULL);
    }

  /* Search for PC within this unit.  */

  ln = (struct line *) bsearch (&pc, lines, entry->u->lines_count,
				sizeof (struct line), line_search);
  if (ln == NULL)
    {
      /* The PC is between the low_pc and high_pc attributes of the
	 compilation unit, but no entry in the line table covers it.
	 This implies that the start of the compilation unit has no
	 line number information.  */

      if (entry->u->abs_filename == NULL)
	{
	  const char *filename;

	  filename = entry->u->filename;
	  if (filename != NULL
	      && !IS_ABSOLUTE_PATH (filename)
	      && entry->u->comp_dir != NULL)
	    {
	      size_t filename_len;
	      const char *dir;
	      size_t dir_len;
	      char *s;

	      filename_len = strlen (filename);
	      dir = entry->u->comp_dir;
	      dir_len = strlen (dir);
	      s = (char *) backtrace_alloc (state, dir_len + filename_len + 2,
					    error_callback, data);
	      if (s == NULL)
		{
		  *found = 0;
		  return 0;
		}
	      memcpy (s, dir, dir_len);
	      /* FIXME: Should use backslash if DOS file system.  */
	      s[dir_len] = '/';
	      memcpy (s + dir_len + 1, filename, filename_len + 1);
	      filename = s;
	    }
	  entry->u->abs_filename = filename;
	}

      return callback (data, pc, entry->u->abs_filename, 0, NULL);
    }

  /* Search for function name within this unit.  */

  if (entry->u->function_addrs_count == 0)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  p = ((struct function_addrs *)
       bsearch (&pc, entry->u->function_addrs,
		entry->u->function_addrs_count,
		sizeof (struct function_addrs),
		function_addrs_search));
  if (p == NULL)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  /* Here pc >= p->low && pc < (p + 1)->low.  The function_addrs are
     sorted by low, so if pc > p->low we are at the end of a range of
     function_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (p + 1)->low)
    ++p;
  fmatch = NULL;
  while (1)
    {
      if (pc < p->high)
	{
	  fmatch = p;
	  break;
	}
      if (p == entry->u->function_addrs)
	break;
      if ((p - 1)->low < p->low)
	break;
      --p;
    }
  if (fmatch == NULL)
    return callback (data, pc, ln->filename, ln->lineno, NULL);

  function = fmatch->function;

  filename = ln->filename;
  lineno = ln->lineno;

  ret = report_inlined_functions (pc, function, callback, data,
				  &filename, &lineno);
  if (ret != 0)
    return ret;

  return callback (data, pc, filename, lineno, function->name);
}